

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O0

string * __thiscall
leveldb::DBTest::Get(string *__return_storage_ptr__,DBTest *this,string *k,Snapshot *snapshot)

{
  DB *pDVar1;
  bool bVar2;
  string local_78;
  Slice local_58;
  Status local_48;
  Status s;
  undefined1 local_38 [8];
  ReadOptions options;
  Snapshot *snapshot_local;
  string *k_local;
  DBTest *this_local;
  string *result;
  
  options.snapshot = snapshot;
  ReadOptions::ReadOptions((ReadOptions *)local_38);
  options._0_8_ = options.snapshot;
  s.state_._7_1_ = 0;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  pDVar1 = this->db_;
  Slice::Slice(&local_58,k);
  (*pDVar1->_vptr_DB[5])(&local_48,pDVar1,local_38,&local_58,__return_storage_ptr__);
  bVar2 = Status::IsNotFound(&local_48);
  if (bVar2) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"NOT_FOUND");
  }
  else {
    bVar2 = Status::ok(&local_48);
    if (!bVar2) {
      Status::ToString_abi_cxx11_(&local_78,&local_48);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_78);
      std::__cxx11::string::~string((string *)&local_78);
    }
  }
  s.state_._7_1_ = 1;
  Status::~Status(&local_48);
  if ((s.state_._7_1_ & 1) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Get(const std::string& k, const Snapshot* snapshot = nullptr) {
    ReadOptions options;
    options.snapshot = snapshot;
    std::string result;
    Status s = db_->Get(options, k, &result);
    if (s.IsNotFound()) {
      result = "NOT_FOUND";
    } else if (!s.ok()) {
      result = s.ToString();
    }
    return result;
  }